

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.h
# Opt level: O0

void __thiscall
CompilerContext::CompilerContext
          (CompilerContext *this,Allocator *allocator,int optimizationLevel,
          ArrayView<InplaceStr> activeImports)

{
  ArrayView<InplaceStr> activeImports_00;
  int optimizationLevel_local;
  Allocator *allocator_local;
  CompilerContext *this_local;
  ArrayView<InplaceStr> activeImports_local;
  
  this->allocator = allocator;
  OutputContext::OutputContext(&this->outputCtx);
  activeImports_00._12_4_ = 0;
  activeImports_00.data = (InplaceStr *)SUB128(activeImports._0_12_,0);
  activeImports_00.count = SUB124(activeImports._0_12_,8);
  ParseContext::ParseContext(&this->parseCtx,allocator,optimizationLevel,activeImports_00);
  ExpressionContext::ExpressionContext(&this->exprCtx,allocator,optimizationLevel);
  InstructionRegVmFinalizeContext::InstructionRegVmFinalizeContext
            (&this->instRegVmFinalizeCtx,&this->exprCtx,allocator);
  this->optimizationLevel = optimizationLevel;
  CompilerStatistics::CompilerStatistics(&this->statistics);
  this->code = (char *)0x0;
  this->moduleRoot = (char *)0x0;
  this->errorPos = (char *)0x0;
  this->errorBuf = (char *)0x0;
  this->errorBufSize = 0;
  this->synModule = (SynModule *)0x0;
  this->exprModule = (ExprModule *)0x0;
  this->exprMemoryLimit = 0;
  this->vmModule = (VmModule *)0x0;
  this->llvmModule = (LlvmModule *)0x0;
  this->regVmLoweredModule = (RegVmLoweredModule *)0x0;
  this->enableLogFiles = false;
  return;
}

Assistant:

CompilerContext(Allocator *allocator, int optimizationLevel, ArrayView<InplaceStr> activeImports): allocator(allocator), parseCtx(allocator, optimizationLevel, activeImports), exprCtx(allocator, optimizationLevel), instRegVmFinalizeCtx(exprCtx, allocator), optimizationLevel(optimizationLevel)
	{
		code = 0;

		moduleRoot = 0;

		errorPos = 0;
		errorBuf = 0;
		errorBufSize = 0;

		synModule = 0;

		exprModule = 0;
		exprMemoryLimit = 0;

		vmModule = 0;

		llvmModule = 0;

		regVmLoweredModule = 0;

		enableLogFiles = false;
	}